

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O3

void elf64_dynamicentry(GlobalVars *gv,uint64_t tag,uint64_t val,Section *relsec)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  Section *sec;
  uint8_t *puVar3;
  Reloc *r;
  bool bVar4;
  Elf64_Dyn dyn;
  
  if (dynamic != (Section *)0x0) {
    bVar4 = elf_endianess == '\x01';
    uVar2 = dynamic->size;
    write64((uint)bVar4,&dyn,tag);
    write64((uint)bVar4,&dyn.d_un,val);
    puVar3 = (uint8_t *)re_alloc(dynamic->data,dynamic->size + 0x10);
    sec = dynamic;
    dynamic->data = puVar3;
    *(uchar (*) [8])(puVar3 + uVar2) = dyn.d_tag;
    *(anon_union_8_2_f9000a74_for_d_un *)((uchar (*) [8])(puVar3 + uVar2) + 1) = dyn.d_un;
    puVar1 = &sec->size;
    *puVar1 = *puVar1 + 0x10;
    if (relsec != (Section *)0x0) {
      r = newreloc(gv,sec,(char *)0x0,relsec,0,uVar2 + 8,'\x01',val);
      r->flags = r->flags | 0x10;
      addreloc(dynamic,r,0,0x40,-1);
    }
    return;
  }
  ierror("elf64_dynamicentry(): .dynamic was never created");
  return;
}

Assistant:

void elf64_dynamicentry(struct GlobalVars *gv,uint64_t tag,uint64_t val,
                        struct Section *relsec)
/* store another entry into the .dynamic section, make new relocation with
   relsec in value-field, when nonzero */
{
  if (dynamic) {
    bool be = elf_endianess == _BIG_ENDIAN_;
    struct Elf64_Dyn dyn;
    unsigned long offs = dynamic->size;

    write64(be,dyn.d_tag,tag);
    write64(be,dyn.d_un.d_val,val);
    dynamic->data = re_alloc(dynamic->data,
                             dynamic->size+sizeof(struct Elf64_Dyn));
    memcpy(dynamic->data+offs,&dyn,sizeof(struct Elf64_Dyn));
    dynamic->size += sizeof(struct Elf64_Dyn);

    if (relsec) {
      /* we need a 64-bit R_ABS relocation for d_val */
      struct Reloc *r;
      int o = offsetof(struct Elf64_Dyn,d_un);

      r = newreloc(gv,dynamic,NULL,relsec,0,offs+o,R_ABS,(lword)val);
      r->flags |= RELF_INTERNAL;  /* just for calculating the address */
      addreloc(dynamic,r,0,64,-1);
    }
  }
  else
    ierror("elf64_dynamicentry(): .dynamic was never created");
}